

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::TaskStmtBlock::~TaskStmtBlock(TaskStmtBlock *this)

{
  TaskStmtBlock *this_local;
  
  ~TaskStmtBlock(this);
  operator_delete(this,0x180);
  return;
}

Assistant:

TaskStmtBlock(Generator *parent, std::string function_name)
        : FunctionStmtBlock(parent, std::move(function_name)) {}